

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::InsertLocalMinimaIntoAEL(Clipper *this,long64 botY)

{
  long *plVar1;
  TEdge *edge;
  HorzJoinRec *pHVar2;
  long lVar3;
  IntPoint pt1a;
  IntPoint pt2a;
  IntPoint pt1b;
  IntPoint pt2b;
  bool bVar4;
  int iVar5;
  TEdge *pTVar6;
  clipperException *this_00;
  ulong uVar7;
  TEdge *pTVar8;
  pointer ppHVar9;
  IntPoint local_88;
  pointer local_70;
  long local_68;
  TEdge *local_60;
  long64 local_58;
  long64 lStack_50;
  IntPoint local_48;
  
  plVar1 = *(long **)(this->_vptr_Clipper[-3] +
                     (long)&(this->m_PolyOuts).
                            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                     );
  local_68 = botY;
  while( true ) {
    if ((plVar1 == (long *)0x0) || (*plVar1 != local_68)) {
      return;
    }
    pTVar8 = (TEdge *)plVar1[1];
    edge = (TEdge *)plVar1[2];
    InsertEdgeIntoAEL(this,pTVar8);
    InsertScanbeam(this,pTVar8->ytop);
    InsertEdgeIntoAEL(this,edge);
    if ((&this->m_ClipFillType)[pTVar8->polyType == ptSubject] == pftEvenOdd) {
      pTVar8->windDelta = 1;
      iVar5 = 1;
    }
    else {
      iVar5 = -pTVar8->windDelta;
    }
    edge->windDelta = iVar5;
    SetWindingCount(this,pTVar8);
    edge->windCnt = pTVar8->windCnt;
    edge->windCnt2 = pTVar8->windCnt2;
    pTVar6 = edge;
    if (ABS(edge->dx + 1e+40) < 1e-20) {
      if (this->m_SortedEdges == (TEdge *)0x0) {
        this->m_SortedEdges = edge;
        edge->nextInSEL = (TEdge *)0x0;
        edge->prevInSEL = (TEdge *)0x0;
      }
      else {
        edge->nextInSEL = this->m_SortedEdges;
        edge->prevInSEL = (TEdge *)0x0;
        this->m_SortedEdges->prevInSEL = edge;
        this->m_SortedEdges = edge;
      }
      pTVar6 = edge->nextInLML;
    }
    InsertScanbeam(this,pTVar6->ytop);
    bVar4 = IsContributing(this,pTVar8);
    if (bVar4) {
      local_88.X = pTVar8->xcurr;
      local_88.Y = **(long64 **)
                     (this->_vptr_Clipper[-3] +
                     (long)&(this->m_PolyOuts).
                            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                     );
      AddLocalMinPoly(this,pTVar8,edge,&local_88);
    }
    local_60 = pTVar8;
    if ((-1 < edge->outIdx) && (ABS(edge->dx + 1e+40) < 1e-20)) {
      ppHVar9 = (this->m_HorizJoins).
                super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_70 = (this->m_HorizJoins).
                 super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_70 != ppHVar9) {
        uVar7 = 0;
        do {
          local_88.X = 0;
          local_88.Y = 0;
          local_48.X = 0;
          local_48.Y = 0;
          pHVar2 = ppHVar9[uVar7];
          pTVar8 = pHVar2->edge;
          pt1a.X = pTVar8->xbot;
          pt1a.Y = pTVar8->ybot;
          pt1b.X = pTVar8->xtop;
          pt1b.Y = pTVar8->ytop;
          pt2a.X = edge->xbot;
          pt2a.Y = edge->ybot;
          local_58 = edge->xtop;
          lStack_50 = edge->ytop;
          pt2b.X = edge->xtop;
          pt2b.Y = edge->ytop;
          bVar4 = GetOverlapSegment(pt1a,pt1b,pt2a,pt2b,&local_88,&local_48);
          if (bVar4) {
            AddJoin(this,pTVar8,edge,pHVar2->savedIdx,-1);
            ppHVar9 = (this->m_HorizJoins).
                      super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_70 = (this->m_HorizJoins).
                       super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)((long)local_70 - (long)ppHVar9 >> 3));
      }
    }
    pTVar8 = local_60;
    if (local_60->nextInAEL != edge) {
      if (((-1 < edge->outIdx) && (-1 < edge->prevInAEL->outIdx)) &&
         (bVar4 = SlopesEqual(edge->prevInAEL,edge,
                              (bool)(this->_vptr_Clipper[-3] + 0x10)
                                    [(long)&(this->m_PolyOuts).
                                            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                    ]), bVar4)) {
        AddJoin(this,edge,edge->prevInAEL,-1,-1);
      }
      local_88.X = pTVar8->xcurr;
      local_88.Y = pTVar8->ycurr;
      for (pTVar8 = pTVar8->nextInAEL; pTVar8 != edge; pTVar8 = pTVar8->nextInAEL) {
        if (pTVar8 == (TEdge *)0x0) {
          this_00 = (clipperException *)__cxa_allocate_exception(0x28);
          clipperException::clipperException
                    (this_00,"InsertLocalMinimaIntoAEL: missing rightbound!");
          __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
        }
        IntersectEdges(this,edge,pTVar8,&local_88,ipNone);
      }
    }
    lVar3 = *(long *)(this->_vptr_Clipper[-3] +
                     (long)&(this->m_PolyOuts).
                            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                     );
    if (lVar3 == 0) break;
    *(undefined8 *)
     (this->_vptr_Clipper[-3] +
     (long)&(this->m_PolyOuts).
            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>) =
         *(undefined8 *)(lVar3 + 0x18);
    plVar1 = *(long **)(this->_vptr_Clipper[-3] +
                       (long)&(this->m_PolyOuts).
                              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                       );
  }
  return;
}

Assistant:

void Clipper::InsertLocalMinimaIntoAEL( const long64 botY)
{
  while(  m_CurrentLM  && ( m_CurrentLM->Y == botY ) )
  {
    TEdge* lb = m_CurrentLM->leftBound;
    TEdge* rb = m_CurrentLM->rightBound;

    InsertEdgeIntoAEL( lb );
    InsertScanbeam( lb->ytop );
    InsertEdgeIntoAEL( rb );

    if (IsEvenOddFillType(*lb))
    {
      lb->windDelta = 1;
      rb->windDelta = 1;
    }
    else
    {
      rb->windDelta = -lb->windDelta;
    }
    SetWindingCount( *lb );
    rb->windCnt = lb->windCnt;
    rb->windCnt2 = lb->windCnt2;

    if( NEAR_EQUAL(rb->dx, HORIZONTAL) )
    {
      //nb: only rightbounds can have a horizontal bottom edge
      AddEdgeToSEL( rb );
      InsertScanbeam( rb->nextInLML->ytop );
    }
    else
      InsertScanbeam( rb->ytop );

    if( IsContributing(*lb) )
      AddLocalMinPoly( lb, rb, IntPoint(lb->xcurr, m_CurrentLM->Y) );

    //if any output polygons share an edge, they'll need joining later ...
    if (rb->outIdx >= 0)
    {
      if (NEAR_EQUAL(rb->dx, HORIZONTAL))
      {
        for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); ++i)
        {
          IntPoint pt, pt2; //returned by GetOverlapSegment() but unused here.
          HorzJoinRec* hj = m_HorizJoins[i];
          //if horizontals rb and hj.edge overlap, flag for joining later ...
          if (GetOverlapSegment(IntPoint(hj->edge->xbot, hj->edge->ybot),
            IntPoint(hj->edge->xtop, hj->edge->ytop),
            IntPoint(rb->xbot, rb->ybot),
            IntPoint(rb->xtop, rb->ytop), pt, pt2))
              AddJoin(hj->edge, rb, hj->savedIdx);
        }
      }
    }

    if( lb->nextInAEL != rb )
    {
      if (rb->outIdx >= 0 && rb->prevInAEL->outIdx >= 0 &&
        SlopesEqual(*rb->prevInAEL, *rb, m_UseFullRange))
          AddJoin(rb, rb->prevInAEL);

      TEdge* e = lb->nextInAEL;
      IntPoint pt = IntPoint(lb->xcurr, lb->ycurr);
      while( e != rb )
      {
        if(!e) throw clipperException("InsertLocalMinimaIntoAEL: missing rightbound!");
        //nb: For calculating winding counts etc, IntersectEdges() assumes
        //that param1 will be to the right of param2 ABOVE the intersection ...
        IntersectEdges( rb , e , pt , ipNone); //order important here
        e = e->nextInAEL;
      }
    }
    PopLocalMinima();
  }
}